

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O0

void __thiscall cmFindBaseDebugState::~cmFindBaseDebugState(cmFindBaseDebugState *this)

{
  cmFindBase *pcVar1;
  string_view sep;
  bool bVar2;
  ulong uVar3;
  string local_288;
  string local_268;
  string local_248;
  undefined1 local_228 [8];
  string path;
  DebugLibState *state;
  iterator __end2;
  iterator __begin2;
  vector<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>
  *__range2;
  bool local_1c5;
  bool local_1c4;
  bool local_1c3;
  bool local_1c2;
  bool local_1c1;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  string_view local_b0;
  string_view local_a0;
  string local_90;
  string local_70;
  string local_50;
  undefined1 local_30 [8];
  string buffer;
  cmFindBaseDebugState *this_local;
  
  buffer.field_2._8_8_ = this;
  if (((this->FindCommand->super_cmFindCommon).DebugMode & 1U) != 0) {
    cmStrCat<std::__cxx11::string&,char_const(&)[38]>
              ((string *)local_30,&this->CommandName,
               (char (*) [38])" called with the following settings:\n");
    cmStrCat<char_const(&)[8],std::__cxx11::string_const&,char_const(&)[2]>
              (&local_50,(char (*) [8])"  VAR: ",&this->FindCommand->VariableName,
               (char (*) [2])0x1156636);
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a0,"\"");
    pcVar1 = this->FindCommand;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b0,"\"");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_c0,"\n         ");
    sep._M_str = local_c0._M_str;
    sep._M_len = local_c0._M_len;
    cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_90,local_a0,&pcVar1->Names,local_b0,sep);
    cmStrCat<char_const(&)[10],std::__cxx11::string,char_const(&)[2]>
              (&local_70,(char (*) [10])"  NAMES: ",&local_90,(char (*) [2])0x1156636);
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    cmStrCat<char_const(&)[18],std::__cxx11::string_const&,char_const(&)[2]>
              (&local_e0,(char (*) [18])"  Documentation: ",
               &this->FindCommand->VariableDocumentation,(char (*) [2])0x1156636);
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::operator+=((string *)local_30,"  Framework\n");
    cmStrCat<char_const(&)[29],bool_const&,char_const(&)[2]>
              (&local_100,(char (*) [29])"    Only Search Frameworks: ",
               &(this->FindCommand->super_cmFindCommon).SearchFrameworkOnly,(char (*) [2])0x1156636)
    ;
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    cmStrCat<char_const(&)[29],bool_const&,char_const(&)[2]>
              (&local_120,(char (*) [29])"    Search Frameworks Last: ",
               &(this->FindCommand->super_cmFindCommon).SearchFrameworkLast,(char (*) [2])0x1156636)
    ;
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    cmStrCat<char_const(&)[30],bool_const&,char_const(&)[2]>
              (&local_140,(char (*) [30])"    Search Frameworks First: ",
               &(this->FindCommand->super_cmFindCommon).SearchFrameworkFirst,(char (*) [2])0x1156636
              );
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::operator+=((string *)local_30,"  AppBundle\n");
    cmStrCat<char_const(&)[28],bool_const&,char_const(&)[2]>
              (&local_160,(char (*) [28])"    Only Search AppBundle: ",
               &(this->FindCommand->super_cmFindCommon).SearchAppBundleOnly,(char (*) [2])0x1156636)
    ;
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    cmStrCat<char_const(&)[28],bool_const&,char_const(&)[2]>
              (&local_180,(char (*) [28])"    Search AppBundle Last: ",
               &(this->FindCommand->super_cmFindCommon).SearchAppBundleLast,(char (*) [2])0x1156636)
    ;
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    cmStrCat<char_const(&)[29],bool_const&,char_const(&)[2]>
              (&local_1a0,(char (*) [29])"    Search AppBundle First: ",
               &(this->FindCommand->super_cmFindCommon).SearchAppBundleFirst,(char (*) [2])0x1156636
              );
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    if (((this->FindCommand->super_cmFindCommon).NoDefaultPath & 1U) == 0) {
      local_1c1 = (bool)(~(this->FindCommand->super_cmFindCommon).NoCMakePath & 1);
      local_1c2 = (bool)(~(this->FindCommand->super_cmFindCommon).NoCMakeEnvironmentPath & 1);
      local_1c3 = (bool)(~(this->FindCommand->super_cmFindCommon).NoSystemEnvironmentPath & 1);
      local_1c4 = (bool)(~(this->FindCommand->super_cmFindCommon).NoCMakeSystemPath & 1);
      local_1c5 = (bool)(~(this->FindCommand->super_cmFindCommon).NoCMakeInstallPath & 1);
      cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>
                (&local_1c0,(char (*) [30])"  CMAKE_FIND_USE_CMAKE_PATH: ",&local_1c1,
                 (char (*) [2])0x1156636,(char (*) [42])"  CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH: ",
                 &local_1c2,(char (*) [2])0x1156636,
                 (char (*) [43])"  CMAKE_FIND_USE_SYSTEM_ENVIRONMENT_PATH: ",&local_1c3,
                 (char (*) [2])0x1156636,(char (*) [37])"  CMAKE_FIND_USE_CMAKE_SYSTEM_PATH: ",
                 &local_1c4,(char (*) [2])0x1156636,
                 (char (*) [34])"  CMAKE_FIND_USE_INSTALL_PREFIX: ",&local_1c5,
                 (char (*) [2])0x1156636);
      std::__cxx11::string::operator+=((string *)local_30,(string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
    }
    else {
      std::__cxx11::string::operator+=((string *)local_30,"  NO_DEFAULT_PATH Enabled\n");
    }
    cmStrCat<std::__cxx11::string&,char_const(&)[38]>
              ((string *)&__range2,&this->CommandName,
               (char (*) [38])" considered the following locations:\n");
    std::__cxx11::string::operator+=((string *)local_30,(string *)&__range2);
    std::__cxx11::string::~string((string *)&__range2);
    __end2 = std::
             vector<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>
             ::begin(&this->FailedSearchLocations);
    state = (DebugLibState *)
            std::
            vector<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>
            ::end(&this->FailedSearchLocations);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<cmFindBaseDebugState::DebugLibState_*,_std::vector<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>_>
                                  *)&state);
      if (!bVar2) break;
      path.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<cmFindBaseDebugState::DebugLibState_*,_std::vector<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>_>
           ::operator*(&__end2);
      cmStrCat<char_const(&)[3],std::__cxx11::string_const&>
                ((string *)local_228,(char (*) [3])0x11062a6,&((reference)path.field_2._8_8_)->path)
      ;
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        cmStrCat<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&>
                  (&local_248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228,
                   (char (*) [2])0x11dc041,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   path.field_2._8_8_);
        std::__cxx11::string::operator=((string *)local_228,(string *)&local_248);
        std::__cxx11::string::~string((string *)&local_248);
      }
      cmStrCat<std::__cxx11::string&,char_const(&)[2]>
                (&local_268,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228,
                 (char (*) [2])0x1156636);
      std::__cxx11::string::operator+=((string *)local_30,(string *)&local_268);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)local_228);
      __gnu_cxx::
      __normal_iterator<cmFindBaseDebugState::DebugLibState_*,_std::vector<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>_>
      ::operator++(&__end2);
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      cmStrCat<char_const(&)[25],std::__cxx11::string&,char_const(&)[2]>
                (&local_288,(char (*) [25])"The item was found at\n  ",
                 &(this->FoundSearchLocation).path,(char (*) [2])0x1156636);
      std::__cxx11::string::operator+=((string *)local_30,(string *)&local_288);
      std::__cxx11::string::~string((string *)&local_288);
    }
    else {
      std::__cxx11::string::operator+=((string *)local_30,"The item was not found.\n");
    }
    cmFindCommon::DebugMessage(&this->FindCommand->super_cmFindCommon,(string *)local_30);
    std::__cxx11::string::~string((string *)local_30);
  }
  DebugLibState::~DebugLibState(&this->FoundSearchLocation);
  std::
  vector<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>
  ::~vector(&this->FailedSearchLocations);
  std::__cxx11::string::~string((string *)&this->CommandName);
  return;
}

Assistant:

cmFindBaseDebugState::~cmFindBaseDebugState()
{
  if (this->FindCommand->DebugMode) {
    std::string buffer =
      cmStrCat(this->CommandName, " called with the following settings:\n");
    buffer += cmStrCat("  VAR: ", this->FindCommand->VariableName, "\n");
    buffer += cmStrCat(
      "  NAMES: ", cmWrap("\"", this->FindCommand->Names, "\"", "\n         "),
      "\n");
    buffer += cmStrCat(
      "  Documentation: ", this->FindCommand->VariableDocumentation, "\n");
    buffer += "  Framework\n";
    buffer += cmStrCat("    Only Search Frameworks: ",
                       this->FindCommand->SearchFrameworkOnly, "\n");

    buffer += cmStrCat("    Search Frameworks Last: ",
                       this->FindCommand->SearchFrameworkLast, "\n");
    buffer += cmStrCat("    Search Frameworks First: ",
                       this->FindCommand->SearchFrameworkFirst, "\n");
    buffer += "  AppBundle\n";
    buffer += cmStrCat("    Only Search AppBundle: ",
                       this->FindCommand->SearchAppBundleOnly, "\n");
    buffer += cmStrCat("    Search AppBundle Last: ",
                       this->FindCommand->SearchAppBundleLast, "\n");
    buffer += cmStrCat("    Search AppBundle First: ",
                       this->FindCommand->SearchAppBundleFirst, "\n");

    if (this->FindCommand->NoDefaultPath) {
      buffer += "  NO_DEFAULT_PATH Enabled\n";
    } else {
      buffer += cmStrCat(
        "  CMAKE_FIND_USE_CMAKE_PATH: ", !this->FindCommand->NoCMakePath, "\n",
        "  CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH: ",
        !this->FindCommand->NoCMakeEnvironmentPath, "\n",
        "  CMAKE_FIND_USE_SYSTEM_ENVIRONMENT_PATH: ",
        !this->FindCommand->NoSystemEnvironmentPath, "\n",
        "  CMAKE_FIND_USE_CMAKE_SYSTEM_PATH: ",
        !this->FindCommand->NoCMakeSystemPath, "\n",
        "  CMAKE_FIND_USE_INSTALL_PREFIX: ",
        !this->FindCommand->NoCMakeInstallPath, "\n");
    }

    buffer +=
      cmStrCat(this->CommandName, " considered the following locations:\n");
    for (auto const& state : this->FailedSearchLocations) {
      std::string path = cmStrCat("  ", state.path);
      if (!state.regexName.empty()) {
        path = cmStrCat(path, "/", state.regexName);
      }
      buffer += cmStrCat(path, "\n");
    }

    if (!this->FoundSearchLocation.path.empty()) {
      buffer += cmStrCat("The item was found at\n  ",
                         this->FoundSearchLocation.path, "\n");
    } else {
      buffer += "The item was not found.\n";
    }

    this->FindCommand->DebugMessage(buffer);
  }
}